

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontroller.cpp
# Opt level: O1

float __thiscall IGameController::EvaluateSpawnPos(IGameController *this,CSpawnEval *pEval,vec2 Pos)

{
  CEntity *pCVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_38;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_34;
  
  pCVar1 = CGameWorld::FindFirst(&this->m_pGameServer->m_World,3);
  if (pCVar1 == (CEntity *)0x0) {
    fVar4 = 0.0;
  }
  else {
    local_38 = Pos.field_0;
    aStack_34 = Pos.field_1;
    fVar4 = 0.0;
    do {
      fVar5 = 1.0;
      if ((pEval->m_FriendlyTeam != -1) &&
         (fVar5 = 1.0, *(int *)(pCVar1[1]._vptr_CEntity + 0x81) == pEval->m_FriendlyTeam)) {
        fVar5 = 0.5;
      }
      fVar2 = local_38.x - (pCVar1->m_Pos).field_0.x;
      fVar3 = aStack_34.y - (pCVar1->m_Pos).field_1.y;
      fVar2 = fVar2 * fVar2 + fVar3 * fVar3;
      if (fVar2 < 0.0) {
        fVar2 = sqrtf(fVar2);
      }
      else {
        fVar2 = SQRT(fVar2);
      }
      fVar4 = fVar4 + fVar5 * (float)(-(uint)(fVar2 == 0.0) & 0x4e6e6b28 |
                                     ~-(uint)(fVar2 == 0.0) & (uint)(1.0 / fVar2));
      pCVar1 = pCVar1->m_pNextTypeEntity;
    } while (pCVar1 != (CEntity *)0x0);
  }
  return fVar4;
}

Assistant:

float IGameController::EvaluateSpawnPos(CSpawnEval *pEval, vec2 Pos) const
{
	float Score = 0.0f;
	CCharacter *pC = static_cast<CCharacter *>(GameServer()->m_World.FindFirst(CGameWorld::ENTTYPE_CHARACTER));
	for(; pC; pC = (CCharacter *)pC->TypeNext())
	{
		// team mates are not as dangerous as enemies
		float Scoremod = 1.0f;
		if(pEval->m_FriendlyTeam != -1 && pC->GetPlayer()->GetTeam() == pEval->m_FriendlyTeam)
			Scoremod = 0.5f;

		float d = distance(Pos, pC->GetPos());
		Score += Scoremod * (d == 0 ? 1000000000.0f : 1.0f/d);
	}

	return Score;
}